

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
rangeless::fn::impl::to<std::set<int,std::less<int>,std::allocator<int>>>::operator()
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          to<std::set<int,std::less<int>,std::allocator<int>>> *this,
          vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *src)

{
  pointer pXVar1;
  X *x;
  pointer __x;
  
  pXVar1 = (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (src->
             super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
             _M_impl.super__Vector_impl_data._M_start; __x != pXVar1; __x = __x + 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique_<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this,
               (_Base_ptr)(this + 8),&__x->value);
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header,
             (_Rb_tree_header *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

Container operator()(Iterable src) && // rvalue-specific because dest will be moved-from
        {
#if 0
            // won't compile with std::set
            dest.insert(dest.end(),
                        std::make_move_iterator(src.begin()),
                        std::make_move_iterator(src.end()));
#else
            for(auto&& x : src) {
                dest.insert(dest.end(), std::move(x));
            }       
#endif
            return std::move(dest);
        }